

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToCFFEmbeddedFontWriter.cpp
# Opt level: O3

unsigned_short __thiscall
Type1ToCFFEmbeddedFontWriter::AddStringToStringsArray
          (Type1ToCFFEmbeddedFontWriter *this,string *inString)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  unsigned_short uVar5;
  BoolAndUShort BVar6;
  iterator iVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_bool>
  pVar8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  local_58;
  
  BVar6 = FindStandardString(this,inString);
  if (((uint)BVar6 & 1) == 0) {
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
            ::find(&(this->mNonStandardStringToIndex)._M_t,inString);
    if ((_Rb_tree_header *)iVar7._M_node ==
        &(this->mNonStandardStringToIndex)._M_t._M_impl.super__Rb_tree_header) {
      iVar2 = *(int *)&(this->mStrings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
      iVar3 = *(int *)&(this->mStrings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      paVar1 = &local_58.first.field_2;
      pcVar4 = (inString->_M_dataplus)._M_p;
      local_58.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar4,pcVar4 + inString->_M_string_length);
      local_58.second = (unsigned_short)((uint)(iVar2 - iVar3) >> 5);
      pVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_short>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_short>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_short>>>
              ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_short>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_short>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_short>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_short>>>
                          *)&this->mNonStandardStringToIndex,&local_58);
      iVar7._M_node = (_Base_ptr)pVar8.first._M_node;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_58.first._M_dataplus._M_p,
                        local_58.first.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->mStrings,inString);
    }
    uVar5 = (short)iVar7._M_node[2]._M_color + 0x187;
  }
  else {
    uVar5 = BVar6.second;
  }
  return uVar5;
}

Assistant:

unsigned short Type1ToCFFEmbeddedFontWriter::AddStringToStringsArray(const std::string& inString)
{
	// first - see if this string exists in the standard strings array
	BoolAndUShort findResult = FindStandardString(inString);	

	if(findResult.first)
	{
		// it is - return the index in the standard strings array
		return findResult.second;
	}

	// it's not - add to strings vector and return the index
	StringToUShortMap::iterator it = mNonStandardStringToIndex.find(inString);
	if(it == mNonStandardStringToIndex.end())
	{
		it = mNonStandardStringToIndex.insert(StringToUShortMap::value_type(inString,(unsigned short)mStrings.size())).first;
		mStrings.push_back(inString);
	}
	return it->second + N_STD_STRINGS;
}